

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

int BuiltinNameToClass(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  bool bVar1;
  PClass *desttype;
  PClass *local_38;
  PClass *cls;
  FName clsname;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  cls._4_4_ = numret;
  _clsname = ret;
  if (numparam != 2) {
    __assert_fail("numparam == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x254a,
                  "int BuiltinNameToClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numret != 1) {
    __assert_fail("numret == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x254b,
                  "int BuiltinNameToClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((param->field_0).field_3.Type != '\0') {
    __assert_fail("param[0].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x254c,
                  "int BuiltinNameToClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type == '\x03') {
    if (ret->RegType == '\x03') {
      FName::FName((FName *)&cls,(param->field_0).i);
      bVar1 = FName::operator!=((FName *)&cls,NAME_None);
      if (bVar1) {
        FName::FName((FName *)((long)&desttype + 4),(FName *)&cls);
        local_38 = PClass::FindClass((FName *)((long)&desttype + 4));
        bVar1 = PClass::IsDescendantOf(local_38,(PClass *)param[1].field_0.field_1.a);
        if (!bVar1) {
          local_38 = (PClass *)0x0;
        }
        VMReturn::SetPointer(_clsname,local_38,1);
      }
      else {
        VMReturn::SetPointer(_clsname,(void *)0x0,1);
      }
      return 1;
    }
    __assert_fail("ret->RegType == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x254e,
                  "int BuiltinNameToClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[1].Type == REGT_POINTER",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x254d,"int BuiltinNameToClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

int BuiltinNameToClass(VMValue *param, TArray<VMValue> &defaultparam, int numparam, VMReturn *ret, int numret)
{
	assert(numparam == 2);
	assert(numret == 1);
	assert(param[0].Type == REGT_INT);
	assert(param[1].Type == REGT_POINTER);
	assert(ret->RegType == REGT_POINTER);

	FName clsname = ENamedName(param[0].i);
	if (clsname != NAME_None)
	{
		const PClass *cls = PClass::FindClass(clsname);
		const PClass *desttype = reinterpret_cast<PClass *>(param[1].a);

		if (!cls->IsDescendantOf(desttype))
		{
			// Let the caller check this. Making this an error with a message is only taking away options from the user.
			cls = nullptr;
		}
		ret->SetPointer(const_cast<PClass *>(cls), ATAG_OBJECT);
	}
	else ret->SetPointer(nullptr, ATAG_OBJECT);
	return 1;
}